

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

enable_if_t<isTupleLikeV<std::tuple<const_std::shared_ptr<const_mathiu::impl::Expr>_&,_const_std::shared_ptr<const_mathiu::impl::Expr>_&>_>,_bool>
 matchit::impl::
 PatternTraits<matchit::impl::Ds<matchit::impl::Wildcard,std::shared_ptr<mathiu::impl::Expr_const>>>
 ::
 matchPatternImpl<std::tuple<std::shared_ptr<mathiu::impl::Expr_const>const&,std::shared_ptr<mathiu::impl::Expr_const>const&>,matchit::impl::Context<bool,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,bool,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,bool,mathiu::impl::Set_const*,bool,bool,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,bool,mathiu::impl::Set_const*,bool,bool,mathiu::impl::True_const*,bool,bool,mathiu::impl::Set_const*,bool,bool,mathiu::impl::Set_const*,bool,bool,mathiu::impl::Set_const*,bool,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool>>
           (tuple<const_std::shared_ptr<const_mathiu::impl::Expr>_&,_const_std::shared_ptr<const_mathiu::impl::Expr>_&>
            *valueTuple,
           Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_> *dsPat,
           int32_t depth,
           Context<bool,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_bool,_bool,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_bool,_bool,_const_mathiu::impl::Set_*,_bool,_bool,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_bool,_bool,_const_mathiu::impl::Set_*,_bool,_bool,_const_mathiu::impl::True_*,_bool,_bool,_const_mathiu::impl::Set_*,_bool,_bool,_const_mathiu::impl::Set_*,_bool,_bool,_const_mathiu::impl::Set_*,_bool,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Union_*,_bool,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Union_*,_bool>
           *context)

{
  type tVar1;
  tuple<const_std::shared_ptr<const_mathiu::impl::Expr>_&,_const_std::shared_ptr<const_mathiu::impl::Expr>_&>
  *local_18;
  int32_t local_10;
  Context<bool,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_bool,_bool,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_bool,_bool,_const_mathiu::impl::Set_*,_bool,_bool,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_bool,_bool,_const_mathiu::impl::Set_*,_bool,_bool,_const_mathiu::impl::True_*,_bool,_bool,_const_mathiu::impl::Set_*,_bool,_bool,_const_mathiu::impl::Set_*,_bool,_bool,_const_mathiu::impl::Set_*,_bool,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Union_*,_bool,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Union_*,_bool>
  *local_8;
  
  local_18 = valueTuple;
  local_10 = depth;
  local_8 = context;
  tVar1 = std::
          __apply_impl<matchit::impl::PatternTraits<matchit::impl::Ds<matchit::impl::Wildcard,std::shared_ptr<mathiu::impl::Expr_const>>>::matchPatternImpl<std::tuple<std::shared_ptr<mathiu::impl::Expr_const>const&,std::shared_ptr<mathiu::impl::Expr_const>const&>,matchit::impl::Context<bool,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,bool,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,bool,mathiu::impl::Set_const*,bool,bool,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,bool,mathiu::impl::Set_const*,bool,bool,mathiu::impl::True_const*,bool,bool,mathiu::impl::Set_const*,bool,bool,mathiu::impl::Set_const*,bool,bool,mathiu::impl::Set_const*,bool,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool,bool,mathiu::i______)_1_,std::tuple<matchit::impl::Wildcard,std::shared_ptr<mathiu::impl::Expr_const>>const&,0ul,1ul>
                    (&local_18);
  return tVar1;
}

Assistant:

constexpr static auto matchPatternImpl(ValueTuple &&valueTuple,
                                                   Ds<Patterns...> const &dsPat,
                                                   int32_t depth, ContextT &context)
                -> std::enable_if_t<isTupleLikeV<ValueTuple>, bool>
            {
                if constexpr (nbOooOrBinder == 0)
                {
                    return std::apply(
                        [&valueTuple, depth, &context](auto const &...patterns)
                        {
                            return apply_(
                                [ depth, &context, &patterns... ](auto &&...values) constexpr
                                {
                                    static_assert(sizeof...(patterns) == sizeof...(values));
                                    return (matchPattern(std::forward<decltype(values)>(values),
                                                         patterns, depth + 1, context) &&
                                            ...);
                                },
                                valueTuple);
                        },
                        dsPat.patterns());
                }
                else if constexpr (nbOooOrBinder == 1)
                {
                    constexpr auto idxOoo = findOooIdx<typename Ds<Patterns...>::Type>();
                    constexpr auto isBinder =
                        isOooBinderV<std::tuple_element_t<idxOoo, std::tuple<Patterns...>>>;
                    constexpr auto isArray = isArrayV<ValueTuple>;
                    auto result = matchPatternMultiple<0, 0, idxOoo>(
                        std::forward<ValueTuple>(valueTuple), dsPat.patterns(), depth,
                        context);
                    constexpr auto valLen = std::tuple_size_v<std::decay_t<ValueTuple>>;
                    constexpr auto patLen = sizeof...(Patterns);
                    if constexpr (isArray)
                    {
                        if constexpr (isBinder)
                        {
                            auto const rangeSize = static_cast<long>(valLen - (patLen - 1));
                            context.emplace_back(makeSubrange(&valueTuple[idxOoo],
                                                              &valueTuple[idxOoo] + rangeSize));
                            using type = decltype(makeSubrange(&valueTuple[idxOoo],
                                                               &valueTuple[idxOoo] + rangeSize));
                            result = result && matchPattern(std::get<type>(context.back()),
                                                            std::get<idxOoo>(dsPat.patterns()),
                                                            depth, context);
                        }
                    }
                    else
                    {
                        static_assert(!isBinder);
                    }
                    return result && matchPatternMultiple<valLen - patLen + idxOoo + 1,
                                                          idxOoo + 1, patLen - idxOoo - 1>(
                                         std::forward<ValueTuple>(valueTuple),
                                         dsPat.patterns(), depth, context);
                }
            }